

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int output_new_symbol(byte_t symbol,byte_t *output_buffer,FILE *output_file_ptr)

{
  adh_node_t *node;
  adh_node_t *new_node;
  int rc;
  bit_array_t bit_array;
  FILE *output_file_ptr_local;
  byte_t *output_buffer_local;
  byte_t symbol_local;
  
  bit_array.buffer._248_8_ = output_file_ptr;
  memset((void *)((long)&new_node + 6),0,0x102);
  symbol_to_bits(symbol,(bit_array_t *)((long)&new_node + 6));
  new_node._0_4_ =
       output_bit_array((bit_array_t *)((long)&new_node + 6),output_buffer,
                        (FILE *)bit_array.buffer._248_8_);
  output_buffer_local._4_4_ = (int)new_node;
  if ((int)new_node == 0) {
    node = adh_create_node_and_append((ushort)symbol);
    adh_update_tree(node,true);
    output_buffer_local._4_4_ = (int)new_node;
  }
  return output_buffer_local._4_4_;
}

Assistant:

int output_new_symbol(byte_t symbol, byte_t *output_buffer, FILE* output_file_ptr) {
    // write symbol code
    bit_array_t bit_array = {0};
    symbol_to_bits(symbol, &bit_array);

#ifdef _DEBUG
    log_debug("  output_new_symbol", "%s out_bit_idx=%-8d bin=%s\n",
              fmt_symbol(symbol), out_bit_idx,
              fmt_bit_array(&bit_array));
#endif
    int rc = output_bit_array(&bit_array, output_buffer, output_file_ptr);
    if(rc != RC_OK)
        return rc;

    adh_node_t* new_node = adh_create_node_and_append(symbol);
    adh_update_tree(new_node, true);
    return rc;
}